

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

VmValue * CompileVmUnaryOp(ExpressionContext *ctx,VmModule *module,ExprUnaryOp *node)

{
  VmValueType VVar1;
  uint uVar2;
  VmInstruction *value;
  TypeRef *pTVar3;
  VmValue *pVVar4;
  TypeBase *pTVar5;
  SynBase *source;
  VmValue *unaff_RBX;
  VmModule *pVVar6;
  TypeBase *pTVar7;
  VmType type;
  VmType type_00;
  uint in_stack_ffffffffffffffb8;
  
  value = (VmInstruction *)CompileVm(ctx,module,node->value);
  switch(*(undefined4 *)&(node->super_ExprBase).field_0x2c) {
  case 1:
    break;
  case 2:
    pVVar6 = (VmModule *)(node->super_ExprBase).source;
    VVar1 = (value->super_VmValue).type.type;
    uVar2 = (value->super_VmValue).type.size;
    if ((uVar2 != 4 || VVar1 != VM_TYPE_INT) &&
       (((VVar1 & ~VM_TYPE_INT) != VM_TYPE_DOUBLE || (uVar2 != 8)))) {
      __assert_fail("value->type == VmType::Int || value->type == VmType::Double || value->type == VmType::Long"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x2b4,
                    "VmValue *(anonymous namespace)::CreateNeg(VmModule *, SynBase *, VmValue *)");
    }
    source = *(SynBase **)&(value->super_VmValue).type;
    pTVar5 = (value->super_VmValue).type.structType;
    pTVar7 = (TypeBase *)0x44;
    goto LAB_00273b91;
  case 3:
    pVVar6 = (VmModule *)(node->super_ExprBase).source;
    VVar1 = (value->super_VmValue).type.type;
    uVar2 = (value->super_VmValue).type.size;
    if ((uVar2 != 4 || VVar1 != VM_TYPE_INT) && ((VVar1 != VM_TYPE_LONG || (uVar2 != 8)))) {
      __assert_fail("value->type == VmType::Int || value->type == VmType::Long",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,699,
                    "VmValue *(anonymous namespace)::CreateNot(VmModule *, SynBase *, VmValue *)");
    }
    source = *(SynBase **)&(value->super_VmValue).type;
    pTVar5 = (value->super_VmValue).type.structType;
    pTVar7 = (TypeBase *)0x45;
LAB_00273b91:
    type.structType = pTVar7;
    type._0_8_ = pTVar5;
    value = anon_unknown.dwarf_22bf96::CreateInstruction
                      ((anon_unknown_dwarf_22bf96 *)module,pVVar6,source,type,
                       (VmInstructionType)value,(VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,
                       (VmValue *)0x0,unaff_RBX);
    break;
  case 4:
    pVVar6 = (VmModule *)(node->super_ExprBase).source;
    if (((value->super_VmValue).type.type == VM_TYPE_AUTO_REF) &&
       ((value->super_VmValue).type.size == 0xc)) {
      pTVar3 = ExpressionContext::GetReferenceType(ctx,ctx->typeVoid);
      if (pTVar3 == (TypeRef *)0x0) {
        __assert_fail("structType",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.h"
                      ,0xcd,"static const VmType VmType::Pointer(TypeBase *)");
      }
      type_00.structType = (TypeBase *)value;
      type_00._0_8_ = pTVar3;
      value = (VmInstruction *)
              anon_unknown.dwarf_22bf96::CreateExtract
                        ((anon_unknown_dwarf_22bf96 *)module,pVVar6,(SynBase *)0x800000006,type_00,
                         (VmValue *)0x4,in_stack_ffffffffffffffb8);
    }
    value = (VmInstruction *)
            anon_unknown.dwarf_22bf96::CreateLogicalNot
                      (module,(SynBase *)pVVar6,&value->super_VmValue);
    break;
  default:
    goto switchD_00273af8_default;
  }
  if (value != (VmInstruction *)0x0) {
    pVVar4 = anon_unknown.dwarf_22bf96::CheckType
                       (ctx,(ExprBase *)(node->super_ExprBase).type,&value->super_VmValue);
    return pVVar4;
  }
switchD_00273af8_default:
  __assert_fail("result",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                ,0xb37,"VmValue *CompileVmUnaryOp(ExpressionContext &, VmModule *, ExprUnaryOp *)");
}

Assistant:

VmValue* CompileVmUnaryOp(ExpressionContext &ctx, VmModule *module, ExprUnaryOp *node)
{
	VmValue *value = CompileVm(ctx, module, node->value);

	VmValue *result = NULL;

	switch(node->op)
	{
	case SYN_UNARY_OP_UNKNOWN:
		break;
	case SYN_UNARY_OP_PLUS:
		result = value;
		break;
	case SYN_UNARY_OP_NEGATE:
		result = CreateNeg(module, node->source, value);
		break;
	case SYN_UNARY_OP_BIT_NOT:
		result = CreateNot(module, node->source, value);
		break;
	case SYN_UNARY_OP_LOGICAL_NOT:
		if(value->type == VmType::AutoRef)
		{
			result = CreateLogicalNot(module, node->source, CreateExtract(module, node->source, VmType::Pointer(ctx.GetReferenceType(ctx.typeVoid)), value, 4));
		}
		else
		{
			result = CreateLogicalNot(module, node->source, value);
		}
		break;
	}

	assert(result);

	return CheckType(ctx, node, result);
}